

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<tinyusdz::value::quatf> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<tinyusdz::value::quatf>
          (optional<tinyusdz::value::quatf> *__return_storage_ptr__,PrimVar *this)

{
  optional<tinyusdz::value::quatf> local_2c;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<tinyusdz::value::quatf>(&local_2c,this);
  nonstd::optional_lite::optional<tinyusdz::value::quatf>::optional<tinyusdz::value::quatf,_0>
            (__return_storage_ptr__,&local_2c);
  nonstd::optional_lite::optional<tinyusdz::value::quatf>::~optional(&local_2c);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }